

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

void __thiscall qpdf::Tokenizer::findEI(Tokenizer *this,InputSource *input)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  unsigned_long uVar7;
  string *context;
  size_type sVar8;
  ulong uVar9;
  ulong uVar10;
  QPDFWordTokenFinder f;
  Tokenizer check;
  allocator<char> local_139;
  ulong local_138;
  long local_130;
  qpdf_offset_t local_128;
  Tokenizer *local_120;
  undefined1 local_118 [48];
  string local_e8 [32];
  Tokenizer local_c8;
  
  local_120 = this;
  local_128 = InputSource::getLastOffset(input);
  iVar6 = (*input->_vptr_InputSource[4])(input);
  local_130 = CONCAT44(extraout_var,iVar6);
  uVar9 = 0;
  do {
    if ((uVar9 & 1) != 0) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"EI",(allocator<char> *)local_e8);
    local_118._0_8_ = &PTR__QPDFWordTokenFinder_002b0150;
    local_118._8_8_ = input;
    std::__cxx11::string::string((string *)(local_118 + 0x10),(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    iVar6 = (*input->_vptr_InputSource[4])(input);
    bVar5 = InputSource::findFirst(input,"EI",CONCAT44(extraout_var_00,iVar6),0,(Finder *)local_118)
    ;
    if (bVar5) {
      iVar6 = (*input->_vptr_InputSource[4])(input);
      local_c8._0_8_ = (CONCAT44(extraout_var_01,iVar6) - local_130) + -2;
      uVar7 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert
                        ((longlong *)&local_c8);
      local_120->inline_image_bytes = uVar7;
      local_138 = uVar9;
      Tokenizer(&local_c8);
      for (uVar10 = 0; (int)uVar10 != 10; uVar10 = (ulong)((int)uVar10 + 1)) {
        std::__cxx11::string::string<std::allocator<char>>(local_e8,"checker",&local_139);
        nextToken(&local_c8,input,context,0);
        std::__cxx11::string::~string(local_e8);
        uVar9 = local_138;
        if (local_c8.type == tt_word) {
          bVar3 = 0;
          bVar2 = 0;
          for (sVar8 = 0; local_c8.raw_val._M_string_length != sVar8; sVar8 = sVar8 + 1) {
            bVar1 = local_c8.raw_val._M_dataplus._M_p[sVar8];
            bVar4 = 1;
            if ((((0x19 < (byte)(bVar1 + 0x9f)) && (bVar1 != 0x2a && 0x19 < (byte)(bVar1 + 0xbf)))
                && (bVar2 = 1, bVar4 = bVar3, (char)bVar1 < ' ')) &&
               ((0xd < bVar1 || ((0x3e01U >> (bVar1 & 0x1f) & 1) == 0)))) goto LAB_001b086a;
            bVar3 = bVar4;
          }
          if ((bool)(bVar3 & bVar2)) goto LAB_001b086a;
        }
        else {
          if (local_c8.type == tt_bad) goto LAB_001b086a;
          if (local_c8.type == tt_eof) break;
        }
      }
      uVar9 = CONCAT71((int7)(uVar10 >> 8),1);
LAB_001b086a:
      ~Tokenizer(&local_c8);
    }
    anon_unknown.dwarf_51eee0::QPDFWordTokenFinder::~QPDFWordTokenFinder
              ((QPDFWordTokenFinder *)local_118);
  } while (bVar5);
  (*input->_vptr_InputSource[5])(input,local_130,0);
  InputSource::setLastOffset(input,local_128);
  return;
}

Assistant:

void
Tokenizer::findEI(InputSource& input)
{
    qpdf_offset_t last_offset = input.getLastOffset();
    qpdf_offset_t pos = input.tell();

    // Use QPDFWordTokenFinder to find EI surrounded by delimiters. Then read the next several
    // tokens or up to EOF. If we find any suspicious-looking or tokens, this is probably still part
    // of the image data, so keep looking for EI. Stop at the first EI that passes. If we get to the
    // end without finding one, return the last EI we found. Store the number of bytes expected in
    // the inline image including the EI and use that to break out of inline image, falling back to
    // the old method if needed.

    bool okay = false;
    bool first_try = true;
    while (!okay) {
        QPDFWordTokenFinder f(input, "EI");
        if (!input.findFirst("EI", input.tell(), 0, f)) {
            break;
        }
        inline_image_bytes = QIntC::to_size(input.tell() - pos - 2);

        Tokenizer check;
        bool found_bad = false;
        // Look at the next 10 tokens or up to EOF. The next inline image's image data would look
        // like bad tokens, but there will always be at least 10 tokens between one inline image's
        // EI and the next valid one's ID since width, height, bits per pixel, and color space are
        // all required as well as a BI and ID. If we get 10 good tokens in a row or hit EOF, we can
        // be pretty sure we've found the actual EI.
        for (int i = 0; i < 10; ++i) {
            check.nextToken(input, "checker");
            auto typ = check.getType();
            if (typ == tt::tt_eof) {
                okay = true;
            } else if (typ == tt::tt_bad) {
                found_bad = true;
            } else if (typ == tt::tt_word) {
                // The qpdf tokenizer lumps alphabetic and otherwise uncategorized characters into
                // "words". We recognize strings of alphabetic characters as potential valid
                // operators for purposes of telling whether we're in valid content or not. It's not
                // perfect, but it should work more reliably than what we used to do, which was
                // already good enough for the vast majority of files.
                bool found_alpha = false;
                bool found_non_printable = false;
                bool found_other = false;
                for (char ch: check.getValue()) {
                    if ((ch >= 'a' && ch <= 'z') || (ch >= 'A' && ch <= 'Z') || (ch == '*')) {
                        // Treat '*' as alpha since there are valid PDF operators that contain *
                        // along with alphabetic characters.
                        found_alpha = true;
                    } else if (static_cast<signed char>(ch) < 32 && !isSpace(ch)) {
                        // Compare ch as a signed char so characters outside of 7-bit will be < 0.
                        found_non_printable = true;
                        break;
                    } else {
                        found_other = true;
                    }
                }
                if (found_non_printable || (found_alpha && found_other)) {
                    found_bad = true;
                }
            }
            if (okay || found_bad) {
                break;
            }
        }
        if (!found_bad) {
            okay = true;
        }
        if (!okay) {
            first_try = false;
        }
    }
    if (okay && (!first_try)) {
        QTC::TC("qpdf", "QPDFTokenizer found EI after more than one try");
    }

    input.seek(pos, SEEK_SET);
    input.setLastOffset(last_offset);
}